

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

mpack_node_t mpack_node_map_key_at(mpack_node_t node,size_t index)

{
  mpack_node_t mVar1;
  
  mVar1 = mpack_node_map_at(node,index,0);
  return mVar1;
}

Assistant:

MPACK_INLINE mpack_node_t mpack_node_map_key_at(mpack_node_t node, size_t index) {
    return mpack_node_map_at(node, index, 0);
}